

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O3

bool ft::
     lexicographical_compare<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::less<int>>
               (long first1,long last1,long first2,long last2)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  
  piVar1 = *(int **)(first1 + 0x10);
  if (piVar1 == *(int **)(last1 + 0x10)) {
    piVar3 = *(int **)(first2 + 0x10);
  }
  else {
    piVar3 = *(int **)(first2 + 0x10);
    do {
      if (piVar3 == *(int **)(last2 + 0x10)) {
        return false;
      }
      if (*piVar3 < *piVar1) {
        return false;
      }
      if (*piVar1 < *piVar3) {
        return true;
      }
      piVar3 = *(int **)(piVar1 + 4);
      if (*(int **)(piVar1 + 4) == (int *)**(undefined8 **)(first1 + 8)) {
        do {
          piVar2 = *(int **)(piVar1 + 6);
          bVar4 = *(int **)(piVar2 + 4) == piVar1;
          piVar1 = piVar2;
        } while (bVar4);
      }
      else {
        do {
          piVar2 = piVar3;
          piVar3 = *(int **)(piVar2 + 2);
        } while (*(int **)(piVar2 + 2) != (int *)**(undefined8 **)(first1 + 8));
      }
      *(int **)(first1 + 0x10) = piVar2;
      piVar1 = *(int **)(*(int **)(first2 + 0x10) + 4);
      piVar2 = *(int **)(first2 + 0x10);
      if (piVar1 == (int *)**(undefined8 **)(first2 + 8)) {
        do {
          piVar3 = *(int **)(piVar2 + 6);
          bVar4 = *(int **)(piVar3 + 4) == piVar2;
          piVar2 = piVar3;
        } while (bVar4);
      }
      else {
        do {
          piVar3 = piVar1;
          piVar1 = *(int **)(piVar3 + 2);
        } while (*(int **)(piVar3 + 2) != (int *)**(undefined8 **)(first2 + 8));
      }
      *(int **)(first2 + 0x10) = piVar3;
      piVar1 = *(int **)(first1 + 0x10);
    } while (piVar1 != *(int **)(last1 + 0x10));
  }
  return piVar3 != *(int **)(last2 + 0x10);
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2, Compare comp,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (first2 == last2 || comp(*first2, *first1)) return false;
		else if (comp(*first1, *first2)) return true;
		++first1; ++first2;
	}
	return first2 != last2;
}